

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instructions.cpp
# Opt level: O0

PSNodesSeq * __thiscall
dg::pta::LLVMPointerGraphBuilder::createLoad(LLVMPointerGraphBuilder *this,Instruction *Inst)

{
  PSNodesSeq *pPVar1;
  PSNode *in_RSI;
  Instruction *in_RDI;
  LLVMPointerGraphBuilder *unaff_retaddr;
  
  createInternalLoad(unaff_retaddr,in_RDI);
  pPVar1 = addNode(unaff_retaddr,(Value *)in_RDI,in_RSI);
  return pPVar1;
}

Assistant:

LLVMPointerGraphBuilder::PSNodesSeq &
LLVMPointerGraphBuilder::createLoad(const llvm::Instruction *Inst) {
    return addNode(Inst, createInternalLoad(Inst));
}